

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Relay.cpp
# Opt level: O2

void __thiscall
RenX_RelayPlugin::process_renx_message
          (RenX_RelayPlugin *this,Server *server,upstream_server_info *server_info,string_view line,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *tokens)

{
  Server *pSVar1;
  deque<RenX_RelayPlugin::UpstreamCommand,_std::allocator<RenX_RelayPlugin::UpstreamCommand>_>
  *this_00;
  char cVar2;
  upstream_settings *puVar3;
  char *pcVar4;
  size_type sVar5;
  pointer pcVar6;
  UpstreamCommand *this_01;
  bool bVar7;
  bool bVar8;
  int iVar9;
  result_type rVar10;
  result_type rVar11;
  result_type_conflict rVar12;
  ostream *poVar13;
  Server *pSVar14;
  RenX_RelayPlugin *this_02;
  long lVar15;
  pointer __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar16;
  long lVar17;
  size_t index;
  basic_string_view<char,_std::char_traits<char>_> __x;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  string_view in_message;
  string_view in_message_00;
  string_view idToken;
  uniform_int_distribution<unsigned_int> dist;
  char *local_aa0;
  container_type player_tokens;
  uniform_int_distribution<unsigned_long> dist_1;
  string_view line_local;
  char *local_a18 [4];
  string line_sanitized;
  
  line_local._M_str = line._M_str;
  line_local._M_len = line._M_len;
  if ((((server_info->m_socket)._M_t.
        super___uniq_ptr_impl<Jupiter::TCPSocket,_std::default_delete<Jupiter::TCPSocket>_>._M_t.
        super__Tuple_impl<0UL,_Jupiter::TCPSocket_*,_std::default_delete<Jupiter::TCPSocket>_>.
        super__Head_base<0UL,_Jupiter::TCPSocket_*,_false>._M_head_impl != (TCPSocket *)0x0) &&
      ((puVar3 = server_info->m_settings, puVar3->m_suppress_chat_logs != true ||
       (bVar7 = std::operator==((tokens->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start,"lCHAT"), !bVar7)))) &&
     ((__str = (tokens->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start, __str->_M_string_length == 0 ||
      (((cVar2 = *(__str->_M_dataplus)._M_p, cVar2 != 'r' && (cVar2 != 'c')) ||
       (server_info->m_processing_command == true)))))) {
    if (puVar3->m_sanitize_names == true) {
      lVar17 = 0;
      bVar7 = false;
      for (lVar15 = 0;
          lVar15 != (long)(tokens->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)__str >> 5;
          lVar15 = lVar15 + 1) {
        pcVar4 = *(char **)((long)&(__str->_M_dataplus)._M_p + lVar17);
        bVar8 = is_player_token(pcVar4,pcVar4 + *(long *)((long)&__str->_M_string_length + lVar17));
        if (bVar8) {
          pbVar16 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    ((long)&(__str->_M_dataplus)._M_p + lVar17);
          jessilib::
          split_n<std::vector,_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    (&player_tokens,pbVar16,',',2);
          idToken._M_len =
               player_tokens.
               super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[1]._M_len;
          idToken._M_str =
               player_tokens.
               super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[1]._M_str;
          std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                    ((string *)&line_sanitized,
                     player_tokens.
                     super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,(allocator<char> *)&dist);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                    (&line_sanitized,',');
          std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                    ((string *)&line_sanitized,&idToken);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                    (&line_sanitized,',');
          if ((idToken._M_len != 0) && (*idToken._M_str == 'b')) {
            idToken._M_str = idToken._M_str + 1;
            idToken._M_len = idToken._M_len - 1;
          }
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    (&line_sanitized,"Player");
          std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                    ((string *)&line_sanitized,&idToken);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                    (pbVar16,&line_sanitized);
          std::__cxx11::string::~string((string *)&line_sanitized);
          std::
          _Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ::~_Vector_base(&player_tokens.
                           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                         );
          bVar7 = true;
        }
        __str = (tokens->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
        lVar17 = lVar17 + 0x20;
      }
    }
    else {
      bVar7 = false;
    }
    if ((puVar3->m_sanitize_ips != false) || (puVar3->m_sanitize_hwids == true)) {
      pSVar1 = server + 0x10;
      for (lVar15 = 0;
          lVar15 != (long)(tokens->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)__str >> 5;
          lVar15 = lVar15 + 1) {
        pbVar16 = __str + lVar15;
        if (puVar3->m_sanitize_ips == true) {
          std::__cxx11::string::string((string *)local_a18,pbVar16);
          iVar9 = Jupiter::Socket::pton4(local_a18[0]);
          pSVar14 = pSVar1;
          if (iVar9 == 0) {
LAB_00136119:
            pSVar14 = (Server *)0x0;
          }
          else {
            do {
              pSVar14 = *(Server **)pSVar14;
              if (pSVar14 == pSVar1) goto LAB_00136119;
            } while (*(int *)(pSVar14 + 0x100) != iVar9);
            pSVar14 = pSVar14 + 0x10;
          }
          std::__cxx11::string::~string((string *)local_a18);
          if (pSVar14 == (Server *)0x0) goto LAB_00136212;
          std::
          mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
          ::seed((mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                  *)&line_sanitized,(long)*(int *)(pSVar14 + 0xfc) * 2 + (this->m_init_time).__d.__r
                );
          dist._M_param._M_a = 10;
          dist._M_param._M_b = 200;
          rVar10 = std::uniform_int_distribution<unsigned_int>::operator()
                             (&dist,(mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                                     *)&line_sanitized);
          rVar11 = std::uniform_int_distribution<unsigned_int>::operator()
                             (&dist,(mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                                     *)&line_sanitized);
          std::uniform_int_distribution<unsigned_int>::operator()
                    (&dist,(mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                            *)&line_sanitized);
          std::uniform_int_distribution<unsigned_int>::operator()
                    (&dist,(mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                            *)&line_sanitized);
          player_tokens.
          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)(ulong)rVar10;
          player_tokens.
          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(ulong)rVar11;
          fmt::v8::vformat_abi_cxx11_(&idToken,"{}.{}.{}.{}",0xb,0x2222,&player_tokens);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (pbVar16,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &idToken);
LAB_00136327:
          std::__cxx11::string::~string((string *)&idToken);
          bVar7 = true;
        }
        else {
LAB_00136212:
          if ((puVar3->m_sanitize_hwids == true) && (sVar5 = pbVar16->_M_string_length, sVar5 != 0))
          {
            pcVar6 = (pbVar16->_M_dataplus)._M_p;
            pSVar14 = pSVar1;
            do {
              pSVar14 = *(Server **)pSVar14;
              if (pSVar14 == pSVar1) goto LAB_00136339;
              __x._M_str = pcVar6;
              __x._M_len = sVar5;
              __y._M_str = *(char **)(pSVar14 + 0xd8);
              __y._M_len = *(size_t *)(pSVar14 + 0xe0);
              bVar8 = std::operator==(__x,__y);
            } while (!bVar8);
            std::
            mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
            ::seed((mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                    *)&line_sanitized,
                   (this->m_init_time).__d.__r + (long)*(int *)(pSVar14 + 0x10c) * 2 + 0x45);
            dist_1._M_param._M_a = 0;
            dist_1._M_param._M_b = 0xffffffffffff;
            rVar12 = std::uniform_int_distribution<unsigned_long>::operator()
                               (&dist_1,(mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                                         *)&line_sanitized);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                      (pbVar16,"m");
            to_hex<unsigned_int>((string *)&idToken,(uint)rVar12);
            to_hex<unsigned_int>((string *)&dist,(uint)(rVar12 >> 0x20));
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &player_tokens,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &idToken,(string *)&dist);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (pbVar16,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &player_tokens);
            std::__cxx11::string::~string((string *)&player_tokens);
            std::__cxx11::string::~string((string *)&dist);
            goto LAB_00136327;
          }
LAB_00136339:
          if (puVar3->m_sanitize_steam_ids == true) {
            pcVar4 = (pbVar16->_M_dataplus)._M_p;
            line_sanitized._M_dataplus._M_p = (pointer)0x0;
            std::from_chars<unsigned_long>
                      (pcVar4,pcVar4 + pbVar16->_M_string_length,(unsigned_long *)&line_sanitized,10
                      );
            pSVar14 = pSVar1;
            if (line_sanitized._M_dataplus._M_p != (pointer)0x0) {
              do {
                pSVar14 = *(Server **)pSVar14;
                if (pSVar14 == pSVar1) goto LAB_001363a5;
              } while (*(pointer *)(pSVar14 + 0xf8) != line_sanitized._M_dataplus._M_p);
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              assign(pbVar16,"0x0000000000000000");
            }
          }
        }
LAB_001363a5:
        __str = (tokens->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      }
    }
    line_sanitized._M_dataplus._M_p = (pointer)&line_sanitized.field_2;
    line_sanitized._M_string_length = 0;
    line_sanitized.field_2._M_local_buf[0] = '\0';
    if (bVar7) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                (&line_sanitized,__str);
      cVar2 = (char)RenX::DelimC;
      lVar17 = 0x20;
      for (lVar15 = 1;
          lVar15 != (long)(tokens->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(tokens->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start >> 5; lVar15 = lVar15 + 1) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (&line_sanitized,cVar2);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (&line_sanitized,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&(((tokens->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar17
                   ));
        lVar17 = lVar17 + 0x20;
      }
    }
    else {
      std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
                ((string *)&line_sanitized,&line_local);
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (&line_sanitized,'\n');
    in_message._M_str = line_sanitized._M_dataplus._M_p;
    in_message._M_len = line_sanitized._M_string_length;
    send_upstream(this,server_info,in_message,server);
    if ((*line_sanitized._M_dataplus._M_p == 'c') && (server_info->m_processing_command == true)) {
      server_info->m_processing_command = false;
      if ((server_info->m_response_queue).
          super__Deque_base<RenX_RelayPlugin::UpstreamCommand,_std::allocator<RenX_RelayPlugin::UpstreamCommand>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          (server_info->m_response_queue).
          super__Deque_base<RenX_RelayPlugin::UpstreamCommand,_std::allocator<RenX_RelayPlugin::UpstreamCommand>_>
          ._M_impl.super__Deque_impl_data._M_start._M_cur) {
        poVar13 = std::operator<<((ostream *)&std::cerr,"COMMAND FINISHED PROCESSING ON EMPTY QUEUE"
                                 );
        std::endl<char,std::char_traits<char>>(poVar13);
      }
      else {
        if (*(this->m_command_tracker).
             super__Deque_base<RenX_RelayPlugin::upstream_server_info_*,_std::allocator<RenX_RelayPlugin::upstream_server_info_*>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur != server_info) {
          __assert_fail("m_command_tracker.front() == &server_info",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Plugins/RenX/RenX.Relay/RenX_Relay.cpp"
                        ,0x21f,
                        "void RenX_RelayPlugin::process_renx_message(RenX::Server &, upstream_server_info &, std::string_view, std::vector<std::string>)"
                       );
        }
        this_00 = &server_info->m_response_queue;
        this_02 = (RenX_RelayPlugin *)&this->m_command_tracker;
        std::
        deque<RenX_RelayPlugin::UpstreamCommand,_std::allocator<RenX_RelayPlugin::UpstreamCommand>_>
        ::pop_front(this_00);
        std::
        deque<RenX_RelayPlugin::upstream_server_info_*,_std::allocator<RenX_RelayPlugin::upstream_server_info_*>_>
        ::pop_front((deque<RenX_RelayPlugin::upstream_server_info_*,_std::allocator<RenX_RelayPlugin::upstream_server_info_*>_>
                     *)this_02);
        player_tokens.
        super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)&player_tokens.
                       super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
        player_tokens.
        super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        player_tokens.
        super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)((ulong)player_tokens.
                              super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage &
                      0xffffffffffffff00);
        while ((this_01 = (server_info->m_response_queue).
                          super__Deque_base<RenX_RelayPlugin::UpstreamCommand,_std::allocator<RenX_RelayPlugin::UpstreamCommand>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_cur,
               (server_info->m_response_queue).
               super__Deque_base<RenX_RelayPlugin::UpstreamCommand,_std::allocator<RenX_RelayPlugin::UpstreamCommand>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur != this_01 &&
               (this_01->m_is_fake == true))) {
          _dist = get_upstream_rcon_username(this_02,server_info,server);
          UpstreamCommand::to_rcon_abi_cxx11_((string *)&idToken,this_01,(string_view *)&dist);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &player_tokens,(string *)&idToken);
          std::__cxx11::string::~string((string *)&idToken);
          in_message_00._M_str =
               (char *)player_tokens.
                       super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
          in_message_00._M_len =
               (size_t)player_tokens.
                       super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
          send_upstream(this,server_info,in_message_00,server);
          this_02 = (RenX_RelayPlugin *)this_00;
          std::
          deque<RenX_RelayPlugin::UpstreamCommand,_std::allocator<RenX_RelayPlugin::UpstreamCommand>_>
          ::pop_front(this_00);
        }
        std::__cxx11::string::~string((string *)&player_tokens);
      }
    }
    std::__cxx11::string::~string((string *)&line_sanitized);
  }
  return;
}

Assistant:

void RenX_RelayPlugin::process_renx_message(RenX::Server& server, upstream_server_info& server_info, std::string_view line, std::vector<std::string> tokens) {
	bool required_sanitization = false;
	if (!server_info.m_socket) {
		// early out: no upstream RCON session
		return;
	}

	const upstream_settings& settings = *server_info.m_settings;
	if (settings.m_suppress_chat_logs
		&& tokens[0] == "lCHAT") {
		return;
	}

	// Suppress unassociated command responses from going upstream
	if (!tokens[0].empty()
		&& (tokens[0][0] == 'r' || tokens[0][0] == 'c')
		&& !server_info.m_processing_command) {
		// This command response wasn't requested upstream; suppress it
		return;
	}

	auto findPlayerByIP = [&server](std::string in_ip) -> const RenX::PlayerInfo* {
		// Parse into integer so we're doing int comparisons instead of strings
		auto ip32 = Jupiter::Socket::pton4(in_ip.c_str());
		if (ip32 == 0) {
			return nullptr;
		}

		// Search players
		for (const auto& player : server.players) {
			if (player.ip32 == ip32) {
				return &player;
			}
		}

		return nullptr;
	};

	auto findPlayerByHWID = [&server](std::string_view in_hwid) -> const RenX::PlayerInfo* {
		if (in_hwid.empty()) {
			return nullptr;
		}

		for (const auto& player : server.players) {
			if (player.hwid == in_hwid) {
				return &player;
			}
		}

		return nullptr;
	};

	auto findPlayerBySteamID = [&server](std::string_view in_steamid) -> const RenX::PlayerInfo* {
		uint64_t steamid{};
		std::from_chars(in_steamid.data(), in_steamid.data() + in_steamid.size(), steamid);
		if (steamid == 0) {
			return nullptr;
		}

		for (const auto& player : server.players) {
			if (player.steamid == steamid) {
				return &player;
			}
		}

		return nullptr;
	};

	if (settings.m_sanitize_names) {
		for (size_t index = 0; index != tokens.size(); ++index) {
			auto& token = tokens[index];
			if (is_player_token(token.data(), token.data() + token.size())) {
				// Get token pieces
				auto player_tokens = jessilib::split_n_view(token, ',', 2);
				std::string_view idToken = player_tokens[1];

				std::string replacement_player = static_cast<std::string>(player_tokens[0]);
				replacement_player += ',';
				replacement_player += idToken;
				replacement_player += ',';
				if (!idToken.empty() && idToken.front() == 'b') {
					idToken.remove_prefix(1);
				}

				// Name (sanitized)
				replacement_player += "Player";
				replacement_player += idToken;

				token = replacement_player;
				required_sanitization = true;
			}
		}
	}

	if (settings.m_sanitize_ips || settings.m_sanitize_hwids) {
		// It's way too much of a pain to check for command usages, and it's not full-proof either (an alias or similar could be added).
		// So instead, we'll just search all messages for any tokens containing any player's IP or HWID.
		// This isn't terribly efficient, but there's only up to 64 players, so not a huge concern
		for (size_t index = 0; index != tokens.size(); ++index) {
			auto& token = tokens[index];
			const RenX::PlayerInfo* player;
			if (settings.m_sanitize_ips) {
				player = findPlayerByIP(token);
				if (player != nullptr) {
					// Initialize the engine here using the init time, so that player fake IPs will be consistent
					// Also include player ID so we get different IPs between players and for each match
					std::mt19937_64 randgen(m_init_time.time_since_epoch().count() + (player->id * 2));
					std::uniform_int_distribution<uint32_t> dist(10, 200);

					// Replace real IP with fake
					//token.format("%u.%u.%u.%u",
					token = fmt::format("{}.{}.{}.{}",
						static_cast<unsigned int>(dist(randgen)),
						static_cast<unsigned int>(dist(randgen)),
						static_cast<unsigned int>(dist(randgen)),
						static_cast<unsigned int>(dist(randgen)));

					required_sanitization = true;
					continue;
				}
			}

			if (settings.m_sanitize_hwids) {
				player = findPlayerByHWID(token);
				if (player != nullptr) {
					// Initialize the engine here using the init time, so that player fake HWIDs will be consistent
					// Also include player ID so we get different HWIDs between players and for each match
					std::mt19937_64 randgen(m_init_time.time_since_epoch().count() + (player->id * 2 + 69));
					std::uniform_int_distribution<uint64_t> dist(0, 0x0000FFFFFFFFFFFFULL);

					HWID hwid{};
					hwid.hwid = dist(randgen);

					token = "m";
					token += to_hex(hwid.left) + to_hex(hwid.right);

					required_sanitization = true;
					continue;
				}
			}

			if (settings.m_sanitize_steam_ids) {
				player = findPlayerBySteamID(token);
				if (player != nullptr) {
					token = g_blank_steamid;
					continue;
				}
			}

			// More sanitization checks here...
		}
	}

	std::string line_sanitized;
	if (required_sanitization) {
		// Construct line to send and send it
		line_sanitized = tokens[0];
		for (size_t index = 1; index != tokens.size(); ++index) {
			line_sanitized += RenX::DelimC;
			line_sanitized += tokens[index];
		}
	}
	else {
		// Forward line without modification
		line_sanitized = line;
	}

	line_sanitized += '\n';
	send_upstream(server_info, line_sanitized, server);

	if (line_sanitized[0] == 'c'
		&& server_info.m_processing_command) {
		auto& queue = server_info.m_response_queue;
		server_info.m_processing_command = false;

		if (queue.empty()) {
			std::cerr << "COMMAND FINISHED PROCESSING ON EMPTY QUEUE" << std::endl;
			return;
		}

		assert(m_command_tracker.front() == &server_info);

		// We've finished executing a real command; pop it and go through any pending fakes
		queue.pop_front();
		m_command_tracker.pop_front();

		std::string response;
		while (!queue.empty() && queue.front().m_is_fake) {
			response = queue.front().to_rcon(get_upstream_rcon_username(server_info, server));
			send_upstream(server_info, response, server);
			queue.pop_front();
		}
	}
}